

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

uchar png_paeth(uchar a,uchar b,uchar c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int pr;
  int pc;
  int pb;
  int pa;
  int p;
  uchar c_local;
  uchar b_local;
  uchar a_local;
  
  iVar1 = ((uint)a + (uint)b) - (uint)c;
  iVar2 = iVar1 - (uint)a;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  iVar3 = iVar1 - (uint)b;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  iVar1 = iVar1 - (uint)c;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (((iVar3 < iVar2) || (pr._0_1_ = a, iVar1 < iVar2)) && (pr._0_1_ = c, iVar3 <= iVar1)) {
    pr._0_1_ = b;
  }
  return (uchar)pr;
}

Assistant:

static unsigned char png_paeth(unsigned char a, unsigned char b, unsigned char c)
{
	int p = (int)a + b - c;
	int pa = abs(p - a);
	int pb = abs(p - b);
	int pc = abs(p - c);

	int pr;

	if(pa <= pb && pa <= pc)
		pr = a;
	else if(pb <= pc)
		pr = b;
	else
		pr = c;

	return (char)pr;
}